

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalPathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::PathDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,ExpressionSyntax *args_3,Token *args_4,
          PathDeclarationSyntax *args_5)

{
  Token openParen;
  Token keyword;
  Token closeParen;
  ConditionalPathDeclarationSyntax *attributes;
  Info *in_RCX;
  PathDeclarationSyntax *in_RDX;
  undefined8 in_R8;
  ExpressionSyntax *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  attributes = (ConditionalPathDeclarationSyntax *)
               allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
  keyword.info = *(Info **)&(in_RDX->super_MemberSyntax).super_SyntaxNode;
  keyword._0_8_ = in_RCX->location;
  openParen.info = (Info *)in_RCX->rawTextPtr;
  openParen._0_8_ = (in_R9->super_SyntaxNode).parent;
  closeParen.info = in_RCX;
  closeParen.kind = (short)in_R8;
  closeParen._2_1_ = (char)((ulong)in_R8 >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  closeParen.rawLen = (int)((ulong)in_R8 >> 0x20);
  slang::syntax::ConditionalPathDeclarationSyntax::ConditionalPathDeclarationSyntax
            (*(ConditionalPathDeclarationSyntax **)&in_R9->super_SyntaxNode,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes,keyword,openParen,
             in_R9,closeParen,in_RDX);
  return attributes;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }